

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::cmMakefile(cmMakefile *this,cmGlobalGenerator *globalGenerator,Snapshot *snapshot)

{
  _Rb_tree_header *p_Var1;
  Snapshot *this_00;
  cmake *pcVar2;
  _Elt_pointer piVar3;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar4;
  cmState *pcVar5;
  undefined1 local_78 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Targets)._M_h._M_buckets = &(this->Targets)._M_h._M_single_bucket;
  (this->Targets)._M_h._M_bucket_count = 1;
  (this->Targets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Targets)._M_h._M_element_count = 0;
  (this->Targets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Targets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Targets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->LinkDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_50 = &(this->ComplainFileRegularExpression).field_2;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TestGenerators).super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComplainFileRegularExpression)._M_dataplus._M_p = (pointer)local_50;
  (this->ComplainFileRegularExpression)._M_string_length = 0;
  (this->ComplainFileRegularExpression).field_2._M_local_buf[0] = '\0';
  local_48 = &this->DefineFlags;
  local_38 = &(this->DefineFlags).field_2;
  (this->DefineFlags)._M_dataplus._M_p = (pointer)local_38;
  (this->DefineFlags)._M_string_length = 0;
  (this->DefineFlags).field_2._M_local_buf[0] = '\0';
  local_40 = &(this->DefineFlagsOrig).field_2;
  (this->DefineFlagsOrig)._M_dataplus._M_p = (pointer)local_40;
  (this->DefineFlagsOrig)._M_string_length = 0;
  (this->DefineFlagsOrig).field_2._M_local_buf[0] = '\0';
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->GlobalGenerator = globalGenerator;
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar4 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar4;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockers).
  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter,0);
  (this->cmDefineRegex).program = (char *)0x0;
  (this->cmDefine01Regex).program = (char *)0x0;
  (this->cmAtVarRegex).program = (char *)0x0;
  (this->cmNamedCurly).program = (char *)0x0;
  memset(&this->UnConfiguredDirectories,0,0x90);
  (this->ImportedTargets)._M_h._M_buckets = &(this->ImportedTargets)._M_h._M_single_bucket;
  (this->ImportedTargets)._M_h._M_bucket_count = 1;
  (this->ImportedTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedTargets)._M_h._M_element_count = 0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OutputToSource)._M_h._M_buckets = &(this->OutputToSource)._M_h._M_single_bucket;
  (this->OutputToSource)._M_h._M_bucket_count = 1;
  (this->OutputToSource)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->OutputToSource)._M_h._M_element_count = 0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->IsSourceFileTryCompile = false;
  (this->OutputToSource)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->OutputToSource)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->QtUiFilesWithOptions).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->QtUiFilesWithOptions).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->QtUiFilesWithOptions).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  this->WarnUnused = pcVar2->WarnUnused;
  this->CheckSystemVars = pcVar2->CheckSystemVars;
  this->SuppressWatches = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->ComplainFileRegularExpression,0,
             (char *)(this->ComplainFileRegularExpression)._M_string_length,0x4d2ed3);
  std::__cxx11::string::_M_replace
            ((ulong)local_48,0,(char *)(this->DefineFlags)._M_string_length,0x4d0e47);
  cmsys::RegularExpression::compile(&this->cmDefineRegex,"#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmDefine01Regex,"#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = &this->StateSnapshot;
  pcVar5 = cmState::Snapshot::GetState(this_00);
  cmState::CreatePolicyScopeSnapshot((Snapshot *)local_78,pcVar5,*this_00);
  (this->StateSnapshot).Position.Position = local_78._16_8_;
  this_00->State = (cmState *)local_78._0_8_;
  (this->StateSnapshot).Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_78._8_8_;
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._0_8_ = (cmState *)0x0;
  local_78._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  cmState::Snapshot::PushPolicy(this_00,(PolicyMap)ZEXT1632(ZEXT816(0)),false);
  local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
  piVar3 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
              (&(this->LoopBlockCounter).c,(int *)local_78);
  }
  else {
    *piVar3 = 0;
    (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar3 + 1;
  }
  this->CheckCMP0000 = false;
  pcVar5 = (cmState *)(local_78 + 0x10);
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  AddSourceGroup(this,(string *)local_78,"^.*$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Source Files","");
  AddSourceGroup(this,(string *)local_78,
                 "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Header Files","");
  AddSourceGroup(this,(string *)local_78,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"CMake Rules","");
  AddSourceGroup(this,(string *)local_78,"\\.rule$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Resources","");
  AddSourceGroup(this,(string *)local_78,"\\.plist$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Object Files","");
  AddSourceGroup(this,(string *)local_78,"\\.(lo|o|obj)$");
  if ((cmState *)local_78._0_8_ != pcVar5) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmState::Snapshot const& snapshot)
  : GlobalGenerator(globalGenerator),
    StateSnapshot(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->WarnUnused = this->GetCMakeInstance()->GetWarnUnused();
  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressWatches = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot = this->StateSnapshot.GetState()
      ->CreatePolicyScopeSnapshot(this->StateSnapshot);

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup
    ("Source Files",
     "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp"
     "|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", "\\.plist$");
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");
#endif
}